

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderSpectatorHud(CHud *this)

{
  int iVar1;
  CConfig *pCVar2;
  char *pcVar3;
  ITextRender *pIVar4;
  long in_RDI;
  long in_FS_OFFSET;
  float fVar5;
  char *pName;
  float Width;
  int SpecMode;
  int SpecID;
  vec2 NamePosition;
  CUIRect Rect;
  char aFlag [64];
  char aBuf [128];
  float in_stack_fffffffffffffe48;
  float in_stack_fffffffffffffe4c;
  CTextCursor *in_stack_fffffffffffffe50;
  CTextCursor *pCVar6;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  char *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  float in_stack_fffffffffffffe6c;
  CTextCursor *in_stack_fffffffffffffe70;
  vec4 *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int iVar7;
  vec2 CursorPosition;
  char *local_168;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int iVar8;
  vector4_base<float> local_128;
  vector4_base<float> local_118;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_f0 [2];
  vector4_base<float> local_e8;
  float local_d8;
  float local_d4;
  float local_d0;
  undefined4 local_cc;
  vec4 local_c8 [4];
  char local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = *(int *)(*(long *)(in_RDI + 8) + 0x1630);
  iVar7 = *(int *)(*(long *)(in_RDI + 8) + 0x162c);
  fVar5 = *(float *)(in_RDI + 0x10) * 0.25 + -2.0;
  local_d8 = *(float *)(in_RDI + 0x10) - fVar5;
  local_d4 = *(float *)(in_RDI + 0x14) - 15.0;
  local_cc = 0x41700000;
  local_d0 = fVar5;
  vector4_base<float>::vector4_base(&local_e8,0.0,0.0,0.0,0.4);
  CUIRect::Draw((CUIRect *)CONCAT44(iVar8,iVar7),(vec4 *)CONCAT44(fVar5,in_stack_fffffffffffffec0),
                (float)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8);
  pCVar2 = CComponent::Config((CComponent *)0x168b7e);
  if ((pCVar2->m_ClShowsocial == 0) || (iVar8 == -1)) {
    local_168 = "";
  }
  else {
    local_168 = (char *)(*(long *)(in_RDI + 8) + 0x4540 + (long)iVar8 * 0x5b0);
  }
  if ((RenderSpectatorHud()::s_SpectateLabelCursor == '\0') &&
     (iVar1 = __cxa_guard_acquire(&RenderSpectatorHud()::s_SpectateLabelCursor), iVar1 != 0)) {
    CTextCursor::CTextCursor
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
    __cxa_atexit(CTextCursor::~CTextCursor,&RenderSpectatorHud::s_SpectateLabelCursor,&__dso_handle)
    ;
    __cxa_guard_release(&RenderSpectatorHud()::s_SpectateLabelCursor);
  }
  CTextCursor::MoveTo(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
  ;
  CLocalizationDatabase::Version(&g_Localization);
  CTextCursor::Reset(in_stack_fffffffffffffe50,
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  CursorPosition = (vec2)local_88;
  pcVar3 = Localize(in_stack_fffffffffffffe60,
                    (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  str_format((char *)CursorPosition,0x80,"%s: ",pcVar3);
  pIVar4 = CComponent::TextRender((CComponent *)0x168cbf);
  (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])
            (pIVar4,&RenderSpectatorHud::s_SpectateLabelCursor,local_88,0xffffffff);
  if ((RenderSpectatorHud()::s_SpectateTargetCursor == '\0') &&
     (iVar1 = __cxa_guard_acquire(&RenderSpectatorHud()::s_SpectateTargetCursor), iVar1 != 0)) {
    CTextCursor::CTextCursor
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
    __cxa_atexit(CTextCursor::~CTextCursor,&RenderSpectatorHud::s_SpectateTargetCursor,&__dso_handle
                );
    __cxa_guard_release(&RenderSpectatorHud()::s_SpectateTargetCursor);
  }
  CTextCursor::Reset(in_stack_fffffffffffffe50,
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  iVar1 = iVar7;
  if (iVar7 == 0) {
    in_stack_fffffffffffffe80 = local_88;
    pcVar3 = Localize(in_stack_fffffffffffffe60,
                      (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    str_format(in_stack_fffffffffffffe80,0x80,"%s",pcVar3);
  }
  else if (iVar7 == 1) {
    str_format(local_88,0x80,"%s",local_168);
  }
  else if (iVar7 - 2U < 2) {
    in_stack_fffffffffffffe78 = local_c8;
    if (iVar7 == 2) {
      in_stack_fffffffffffffe70 =
           (CTextCursor *)
           Localize(in_stack_fffffffffffffe60,
                    (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
    else {
      in_stack_fffffffffffffe70 =
           (CTextCursor *)
           Localize(in_stack_fffffffffffffe60,
                    (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
    str_format((char *)in_stack_fffffffffffffe78,0x40,(char *)in_stack_fffffffffffffe70);
    if (iVar8 == -1) {
      str_format(local_88,0x80,"%s",local_c8);
    }
    else {
      str_format(local_88,0x80,"%s (%s)",local_c8,local_168);
    }
  }
  CTextCursor::BoundingBox(in_stack_fffffffffffffe50);
  fVar5 = CTextBoundingBox::Right((CTextBoundingBox *)&stack0xffffffffffffff00);
  vector2_base<float>::vector2_base
            ((vector2_base<float> *)local_f0,fVar5 + 3.0,*(float *)(in_RDI + 0x14) - 13.0);
  if ((iVar1 == 1) || (iVar8 != -1)) {
    CComponent::UI((CComponent *)0x168f5b);
    fVar5 = 1.0;
    vector4_base<float>::vector4_base(&local_118,1.0,1.0,1.0,0.5);
    vector4_base<float>::vector4_base(&local_128,0.1,0.1,0.1,fVar5);
    fVar5 = CUI::DrawClientID((CUI *)CONCAT44(iVar7,in_stack_fffffffffffffe88),
                              (float)((ulong)in_stack_fffffffffffffe80 >> 0x20),CursorPosition,
                              (int)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                              (vec4 *)in_stack_fffffffffffffe70);
    local_f0[0].x = fVar5 + local_f0[0].x;
  }
  pCVar6 = &RenderSpectatorHud::s_SpectateTargetCursor;
  CTextCursor::MoveTo(&RenderSpectatorHud::s_SpectateTargetCursor,in_stack_fffffffffffffe4c,
                      in_stack_fffffffffffffe48);
  pIVar4 = CComponent::TextRender((CComponent *)0x16903f);
  (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])(pIVar4,pCVar6,local_88,0xffffffff);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderSpectatorHud()
{
	const int SpecID = m_pClient->m_Snap.m_SpecInfo.m_SpectatorID;
	const int SpecMode = m_pClient->m_Snap.m_SpecInfo.m_SpecMode;

	// draw the box
	const float Width = m_Width * 0.25f - 2.0f;
	CUIRect Rect = {m_Width-Width, m_Height-15.0f, Width, 15.0f};
	Rect.Draw(vec4(0.0f, 0.0f, 0.0f, 0.4f), 5.0f, CUIRect::CORNER_TL);

	// draw the text
	const char *pName = Config()->m_ClShowsocial && SpecID != -1 ? m_pClient->m_aClients[SpecID].m_aName : "";
	char aBuf[128];

	static CTextCursor s_SpectateLabelCursor(8.0f);
	s_SpectateLabelCursor.MoveTo(m_Width-Width+6.0f, m_Height-13.0f);
	s_SpectateLabelCursor.Reset(g_Localization.Version());
	str_format(aBuf, sizeof(aBuf), "%s: ", Localize("Spectate"));
	TextRender()->TextOutlined(&s_SpectateLabelCursor, aBuf, -1);

	static CTextCursor s_SpectateTargetCursor(8.0f);
	s_SpectateTargetCursor.Reset();

	switch(SpecMode)
	{
	case SPEC_FREEVIEW:
		str_format(aBuf, sizeof(aBuf), "%s", Localize("Free-View"));
		break;
	case SPEC_PLAYER:
		str_format(aBuf, sizeof(aBuf), "%s", pName);
		break;
	case SPEC_FLAGRED:
	case SPEC_FLAGBLUE:
		char aFlag[64];
		str_format(aFlag, sizeof(aFlag), SpecMode == SPEC_FLAGRED ? Localize("Red Flag") : Localize("Blue Flag"));

		if(SpecID != -1)
			str_format(aBuf, sizeof(aBuf), "%s (%s)", aFlag, pName);
		else
			str_format(aBuf, sizeof(aBuf), "%s", aFlag);
		break;
	}

	vec2 NamePosition = vec2(s_SpectateLabelCursor.BoundingBox().Right()+3.0f, m_Height-13.0f);
	if(SpecMode == SPEC_PLAYER || SpecID != -1)
		NamePosition.x += UI()->DrawClientID(s_SpectateTargetCursor.m_FontSize, NamePosition, SpecID);

	s_SpectateTargetCursor.MoveTo(NamePosition.x, NamePosition.y);
	TextRender()->TextOutlined(&s_SpectateTargetCursor, aBuf, -1);
}